

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.hpp
# Opt level: O0

void __thiscall
myvk::Buffer::
UpdateData<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
          (Buffer *this,
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          begin,__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                end,uint32_t byte_offset)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first_00;
  undefined4 in_ECX;
  Buffer *in_RDX;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_RSI;
  Buffer *in_RDI;
  uint *in_stack_ffffffffffffffd0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_RDI->m_mapped_ptr == (void *)0x0) {
    Map(in_RDX);
    __first_00._M_current._4_4_ = in_ECX;
    __first_00._M_current._0_4_ = in_stack_ffffffffffffffe0;
    std::
    copy<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int*>
              (__first_00,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    Unmap(in_RDX);
  }
  else {
    GetMappedData(in_RDI);
    __first._M_current._4_4_ = in_ECX;
    __first._M_current._0_4_ = in_stack_ffffffffffffffe0;
    std::
    copy<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int*>
              (__first,in_RSI,(uint *)in_RDX);
  }
  return;
}

Assistant:

inline void UpdateData(Iter begin, Iter end, uint32_t byte_offset = 0) const {
		using T = typename std::iterator_traits<Iter>::value_type;
		if (m_mapped_ptr) {
			std::copy(begin, end, (T *)((uint8_t *)GetMappedData() + byte_offset));
		} else {
			std::copy(begin, end, (T *)((uint8_t *)Map() + byte_offset));
			Unmap();
		}
	}